

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetCommandListAppendMetricQueryBegin
          (zet_command_list_handle_t hCommandList,zet_metric_query_handle_t hMetricQuery)

{
  zet_pfnCommandListAppendMetricQueryBegin_t pfnAppendMetricQueryBegin;
  ze_result_t result;
  zet_metric_query_handle_t hMetricQuery_local;
  zet_command_list_handle_t hCommandList_local;
  
  pfnAppendMetricQueryBegin._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c830 != (code *)0x0) {
    pfnAppendMetricQueryBegin._4_4_ = (*DAT_0011c830)(hCommandList,hMetricQuery);
  }
  return pfnAppendMetricQueryBegin._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetCommandListAppendMetricQueryBegin(
        zet_command_list_handle_t hCommandList,         ///< [in] handle of the command list
        zet_metric_query_handle_t hMetricQuery          ///< [in] handle of the metric query
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendMetricQueryBegin = context.zetDdiTable.CommandList.pfnAppendMetricQueryBegin;
        if( nullptr != pfnAppendMetricQueryBegin )
        {
            result = pfnAppendMetricQueryBegin( hCommandList, hMetricQuery );
        }
        else
        {
            // generic implementation
        }

        return result;
    }